

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  Nonnull<char_*> out_00;
  Nonnull<char_*> pcVar4;
  long lVar5;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  uint64_t result_size;
  uint64_t kMaxSize;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = AlphaNum::size((AlphaNum *)this);
  sVar2 = AlphaNum::size(a);
  sVar3 = AlphaNum::size(b);
  strings_internal::STLStringResizeUninitialized<std::__cxx11::string,void>
            (__return_storage_ptr__,sVar1 + sVar2 + sVar3);
  out_00 = (Nonnull<char_*>)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  pcVar4 = anon_unknown_5::Append(out_00,(AlphaNum *)this);
  pcVar4 = anon_unknown_5::Append(pcVar4,a);
  pcVar4 = anon_unknown_5::Append(pcVar4,b);
  lVar5 = std::__cxx11::string::size();
  if (pcVar4 == out_00 + lVar5) {
    return __return_storage_ptr__;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                ,0x61,
                "std::string absl::StrCat(const AlphaNum &, const AlphaNum &, const AlphaNum &)");
}

Assistant:

std::string StrCat(const AlphaNum& a, const AlphaNum& b, const AlphaNum& c) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  const uint64_t result_size = static_cast<uint64_t>(a.size()) +
                               static_cast<uint64_t>(b.size()) +
                               static_cast<uint64_t>(c.size());
  ABSL_INTERNAL_CHECK(result_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(result_size));
  char* const begin = &result[0];
  char* out = begin;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + result.size());
  return result;
}